

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_fs.c
# Opt level: O1

int picnic_l5_fs_validate_keypair(picnic_l5_fs_privatekey_t *sk,picnic_l5_fs_publickey_t *pk)

{
  int iVar1;
  picnic_instance_t *lowmc;
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t buffer [32];
  mzd_local_t mStack_e0;
  mzd_local_t local_c0;
  mzd_local_t local_a0;
  uint8_t local_80 [80];
  
  iVar1 = -1;
  if (pk != (picnic_l5_fs_publickey_t *)0x0 && sk != (picnic_l5_fs_privatekey_t *)0x0) {
    lowmc = picnic_instance_get(Picnic_L5_FS);
    if ((*(undefined1 (*) [32])(sk->data + 0x40) == *(undefined1 (*) [32])(pk->data + 0x20)) &&
       (*(undefined1 (*) [32])(sk->data + 0x20) == *(undefined1 (*) [32])pk->data)) {
      mzd_from_char_array(&local_a0,sk->data + 0x40,0x20);
      mzd_from_char_array(&local_c0,sk->data,0x20);
      lowmc_compute(&lowmc->lowmc,&local_c0,&local_a0,&mStack_e0);
      mzd_to_char_array(local_80,&mStack_e0,0x20);
      iVar1 = memcmp(local_80,pk,0x20);
    }
  }
  return iVar1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_fs_validate_keypair(const picnic_l5_fs_privatekey_t* sk,
                                                            const picnic_l5_fs_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* pk_pt = PK_PT(pk);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (memcmp(sk_pt, pk_pt, LOWMC_BLOCK_SZ) != 0 || memcmp(sk_c, pk_c, LOWMC_BLOCK_SZ) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, LOWMC_BLOCK_SZ);

  return memcmp(buffer, pk_c, LOWMC_BLOCK_SZ);
}